

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O3

void make_terrible(artifact *art,object *obj)

{
  int16_t *piVar1;
  int16_t *piVar2;
  _Bool **pp_Var3;
  _Bool **pp_Var4;
  _Bool **pp_Var5;
  _Bool **pp_Var6;
  undefined2 uVar7;
  undefined2 uVar8;
  byte bVar9;
  int16_t *piVar10;
  int16_t *piVar11;
  int16_t *piVar12;
  int16_t *piVar13;
  int16_t *piVar14;
  obj_property *poVar15;
  _Bool _Var16;
  _Bool _Var17;
  short sVar18;
  int16_t iVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  wchar_t wVar23;
  object_kind *kind;
  activation **ppaVar24;
  int16_t *piVar25;
  int16_t *piVar26;
  wchar_t *pwVar27;
  short sVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  wchar_t wVar32;
  int iVar33;
  wchar_t pick;
  int16_t *piVar34;
  bitflag *flags;
  int16_t *piVar35;
  element_info *peVar36;
  short *psVar37;
  ulong uVar38;
  int iVar39;
  _Bool *p_Var40;
  _Bool **pp_Var41;
  long lVar42;
  bool bVar43;
  long lVar44;
  undefined1 auVar45 [16];
  
  if (art == (artifact *)0x0) {
    wVar32 = (wchar_t)obj->tval;
    wVar23 = (wchar_t)obj->sval;
  }
  else {
    wVar32 = art->tval;
    wVar23 = art->sval;
  }
  kind = lookup_kind(wVar32,wVar23);
  _Var16 = tval_is_melee_weapon_k(kind);
  if (potential < L'ඬ') {
    iVar33 = (L'ஷ' < potential) + 1;
  }
  else {
    uVar20 = Rand_div(3);
    iVar33 = 3 - (uint)(uVar20 == 0);
  }
  if (((art == (artifact *)0x0) || (art->activation == (activation *)0x0)) ||
     (uVar20 = Rand_div(3), uVar20 == 0)) {
    if (((obj == (object *)0x0) || (obj->activation == (activation *)0x0)) ||
       (uVar20 = Rand_div(3), uVar20 == 0)) goto LAB_0018e59a;
    ppaVar24 = &obj->activation;
  }
  else {
    ppaVar24 = &art->activation;
  }
  *ppaVar24 = (activation *)0x0;
LAB_0018e59a:
  uVar20 = Rand_div(2);
  if (-2 < (int)uVar20) {
    piVar1 = art->modifiers;
    piVar2 = obj->modifiers;
    pp_Var3 = &art->slays;
    pp_Var4 = &obj->slays;
    bVar43 = art != (artifact *)0x0;
    piVar11 = obj->modifiers;
    if (bVar43) {
      piVar11 = art->modifiers;
    }
    flags = obj->flags;
    if (bVar43) {
      flags = art->flags;
    }
    piVar10 = obj->modifiers + 1;
    piVar12 = obj->modifiers;
    piVar13 = obj->modifiers;
    if (bVar43) {
      piVar10 = art->modifiers + 1;
      piVar12 = art->modifiers;
      piVar13 = art->modifiers;
    }
    piVar25 = piVar2;
    piVar14 = obj->modifiers;
    if (bVar43) {
      piVar25 = piVar1;
      piVar14 = art->modifiers;
    }
    pp_Var5 = &art->brands;
    pp_Var6 = &obj->brands;
    iVar39 = 0;
    do {
      if (((_Var16) && (_Var17 = has_property(art,obj,"skill bonus"), _Var17)) &&
         (uVar21 = Rand_div(2), uVar21 == 0)) {
LAB_0018e7ac:
        if (art == (artifact *)0x0) {
          uVar21 = Rand_div(2);
          if (uVar21 == 0) {
            uVar21 = Rand_div(7);
            obj->to_h = (short)uVar21 * -2 + -0xc;
            uVar21 = Rand_div(3);
            if (uVar21 != 0) {
              uVar21 = Rand_div(7);
              sVar28 = (short)uVar21 * -2 + -0xc;
              goto LAB_0018eae7;
            }
          }
          else {
            sVar18 = obj->to_h;
            if (0 < sVar18) {
              obj->to_h = -sVar18;
              sVar18 = 1;
            }
            sVar28 = obj->to_d;
            if (sVar28 < 1) {
              if ((sVar28 == 0 && sVar18 == 0) && (uVar21 = Rand_div(5), uVar21 == 0)) {
                uVar21 = Rand_div(4);
                uVar7 = obj->to_h;
                uVar8 = obj->to_d;
                auVar45 = ZEXT416(uVar21 * -5 - 10);
                auVar45 = pshuflw(auVar45,auVar45,0);
                obj->to_h = auVar45._0_2_ + uVar7;
                obj->to_d = auVar45._2_2_ + uVar8;
              }
            }
            else {
              sVar28 = -sVar28;
LAB_0018eae7:
              obj->to_d = sVar28;
            }
          }
        }
        else {
          _Var17 = tval_is_weapon_a(art);
          if (_Var17) {
            uVar21 = Rand_div(7);
            art->to_h = (short)uVar21 * -2 + -0xc;
            uVar21 = Rand_div(3);
            if (uVar21 == 0) {
LAB_0018eb09:
              sVar28 = art->to_d;
            }
            else {
              uVar21 = Rand_div(7);
              sVar18 = (short)uVar21 * 2;
              sVar28 = -0xc;
LAB_0018e800:
              sVar28 = sVar28 - sVar18;
              art->to_d = sVar28;
            }
            if (sVar28 < 0) goto LAB_0018eb21;
            if (art->to_h < 0) goto LAB_0018eb29;
            wVar32 = art->cost;
          }
          else {
            sVar28 = art->to_h;
            if (0 < sVar28) {
              art->to_h = -sVar28;
              sVar28 = 1;
            }
            sVar18 = art->to_d;
            if (sVar18 < 1) {
              if (sVar18 == 0) {
                if ((sVar28 != 0) || (uVar21 = Rand_div(5), uVar21 != 0)) goto LAB_0018eb09;
                uVar21 = Rand_div(4);
                sVar18 = (short)uVar21 * 5 + 10;
                art->to_h = art->to_h - sVar18;
                sVar28 = art->to_d;
                goto LAB_0018e800;
              }
            }
            else {
              art->to_d = -sVar18;
            }
LAB_0018eb21:
            if (art->to_h < 0) {
              wVar32 = art->cost;
              iVar29 = -10000;
            }
            else {
LAB_0018eb29:
              wVar32 = art->cost;
              iVar29 = -5000;
            }
            wVar32 = wVar32 + iVar29;
            art->cost = wVar32;
          }
          if (wVar32 < L'\0') {
            art->cost = L'\0';
          }
        }
      }
      else {
        _Var17 = has_property(art,obj,"armor bonus");
        if ((_Var17) && (uVar21 = Rand_div(2), uVar21 == 0)) {
LAB_0018e743:
          if (art == (artifact *)0x0) {
            if ((obj->ac == 0) || (uVar21 = Rand_div(6), uVar21 != 0)) {
              uVar21 = Rand_div(4);
              if (uVar21 == 0) {
                uVar21 = Rand_div(3);
                obj->to_a = (short)uVar21 * -5 + -0xf;
              }
            }
            else {
              obj->ac = 0;
            }
          }
          else {
            if ((art->ac != 0) && (uVar21 = Rand_div(6), uVar21 == 0)) {
              art->cost = art->cost + art->ac * -500;
              art->ac = 0;
            }
            if ((art->tval < L'\n') || (art->to_a < 0)) {
              uVar21 = Rand_div(4);
              if ((uVar21 == 0) && (art->tval < L'\n')) {
                uVar21 = Rand_div(3);
                art->to_a = (short)uVar21 * -5 + -0xf;
                art->cost = uVar21 * -1000 + art->cost + L'\xfffff448';
              }
              sVar28 = art->to_a;
            }
            else {
              uVar21 = Rand_div(7);
              sVar28 = (short)uVar21 * -2 + -0xc;
              art->to_a = sVar28;
            }
            if (sVar28 < 0) {
              art->cost = art->cost + sVar28 * 400;
            }
          }
          goto LAB_0018efca;
        }
        uVar21 = Rand_div(2);
        if (uVar21 == 0) {
          uVar22 = Rand_div(3);
          if (uVar22 == 0) {
            uVar22 = Rand_div(5);
            sVar28 = -4 - (short)uVar22;
            uVar22 = Rand_div(3);
            lVar42 = 0x12;
            piVar26 = art->modifiers + 1;
            piVar34 = obj->modifiers + 1;
            auVar45 = _DAT_00224940;
            do {
              bVar43 = SUB164(auVar45 ^ _DAT_00224950,4) == -0x80000000 &&
                       SUB164(auVar45 ^ _DAT_00224950,0) < -0x7fffffef;
              if (bVar43) {
                piVar35 = piVar34;
                if (art != (artifact *)0x0) {
                  piVar35 = piVar26;
                }
                piVar35[-1] = 0;
              }
              if (bVar43) {
                piVar35 = piVar34;
                if (art != (artifact *)0x0) {
                  piVar35 = piVar26;
                }
                *piVar35 = 0;
              }
              lVar44 = auVar45._8_8_;
              auVar45._0_8_ = auVar45._0_8_ + 2;
              auVar45._8_8_ = lVar44 + 2;
              piVar34 = piVar34 + 2;
              piVar26 = piVar26 + 2;
              lVar42 = lVar42 + -2;
            } while (lVar42 != 0);
            if (uVar22 == 0) {
              sVar28 = sVar28 * 5;
            }
            uVar22 = Rand_div(5);
            if (uVar22 == 0) {
              *piVar25 = sVar28;
              piVar12[3] = sVar28;
              piVar26 = piVar14 + 4;
LAB_0018ebe8:
              *piVar26 = sVar28;
            }
            else {
              uVar22 = Rand_div(4);
              if (uVar22 == 0) {
                *piVar10 = sVar28;
                piVar26 = piVar13 + 2;
                goto LAB_0018ebe8;
              }
              uVar22 = Rand_div(6);
              piVar26 = piVar11 + 9;
              if (uVar22 == 0) goto LAB_0018ebe8;
              lVar42 = 0;
              do {
                uVar22 = Rand_div(4);
                if (uVar22 == 0) {
                  piVar26 = piVar2;
                  if (art != (artifact *)0x0) {
                    piVar26 = piVar1;
                  }
                  *(short *)((long)piVar26 + lVar42) = sVar28;
                }
                lVar42 = lVar42 + 2;
              } while (lVar42 != 10);
            }
            uVar22 = Rand_div(2);
            iVar33 = iVar33 + uVar22 + 1;
            if (art == (artifact *)0x0) goto LAB_0018ec30;
            iVar29 = -60000;
            wVar32 = L'\xea60';
          }
          else {
            lVar42 = 0;
            do {
              piVar26 = piVar2;
              if (art != (artifact *)0x0) {
                piVar26 = piVar1;
              }
              if (0 < *(short *)(lVar42 + (long)piVar26)) {
                *(short *)((long)piVar26 + lVar42) = -*(short *)(lVar42 + (long)piVar26);
              }
              lVar42 = lVar42 + 2;
            } while (lVar42 != 10);
            if (art == (artifact *)0x0) goto LAB_0018ec30;
            iVar29 = -30000;
            wVar32 = L'田';
          }
          wVar23 = iVar29 + art->cost;
          if (art->cost < wVar32) {
            wVar23 = L'\0';
          }
          art->cost = wVar23;
        }
        else {
          if (uVar21 == 0xffffffff) goto LAB_0018e7ac;
          if (uVar21 == 0xfffffffe) goto LAB_0018e743;
        }
LAB_0018ec30:
        if (uVar21 != 1) goto LAB_0018efca;
        if (art == (artifact *)0x0) {
          obj->modifiers[10] = 0;
          uVar21 = Rand_div(4);
          if (uVar21 == 0) {
            obj->modifiers[0xb] = 0;
          }
          uVar21 = Rand_div(4);
          piVar26 = obj->modifiers;
        }
        else {
          art->modifiers[10] = 0;
          uVar21 = Rand_div(4);
          if (uVar21 == 0) {
            art->modifiers[0xb] = 0;
          }
          uVar21 = Rand_div(4);
          piVar26 = art->modifiers;
        }
        if (uVar21 == 0) {
          piVar26[0xc] = 0;
        }
        uVar31 = 0;
        if (z_info->slay_max == '\0') {
          uVar38 = 0;
        }
        else {
          uVar38 = 0;
          do {
            if (art == (artifact *)0x0) {
              p_Var40 = (_Bool *)0x0;
            }
            else {
              p_Var40 = *pp_Var3 + uVar38;
              if (*pp_Var3 == (_Bool *)0x0) {
                p_Var40 = (_Bool *)0x0;
              }
            }
            if ((obj != (object *)0x0) && (*pp_Var4 != (_Bool *)0x0)) {
              p_Var40 = *pp_Var4 + uVar38;
            }
            uVar21 = Rand_div(3);
            if ((uVar21 == 0) && (p_Var40 != (_Bool *)0x0)) {
              *p_Var40 = false;
            }
            uVar38 = uVar38 + 1;
            bVar9 = z_info->slay_max;
            uVar30 = (uint)bVar9;
          } while (uVar38 < bVar9);
          uVar38 = 0;
          if (bVar9 != 0) {
            uVar38 = 0;
            do {
              if (((art != (artifact *)0x0) && (*pp_Var3 != (_Bool *)0x0)) &&
                 ((*pp_Var3)[uVar38] != false)) goto LAB_0018ed9f;
              uVar31 = (uint)bVar9;
              if (((obj != (object *)0x0) && (*pp_Var4 != (_Bool *)0x0)) &&
                 ((*pp_Var4)[uVar38] != false)) goto LAB_0018ed89;
              uVar38 = uVar38 + 1;
            } while (bVar9 != uVar38);
            uVar38 = (ulong)uVar31;
          }
        }
LAB_0018ed89:
        uVar30 = uVar31;
        if ((art == (artifact *)0x0) || (pp_Var41 = pp_Var3, (uint)uVar38 != uVar30)) {
LAB_0018ed9f:
          if ((obj != (object *)0x0) && (pp_Var41 = pp_Var4, (uint)uVar38 == uVar30))
          goto LAB_0018edad;
        }
        else {
LAB_0018edad:
          mem_free(*pp_Var41);
          *pp_Var41 = (_Bool *)0x0;
        }
        uVar21 = Rand_div(3);
        if (uVar21 == 0) {
          flag_off(flags,6,0x2a);
        }
        uVar31 = 0;
        if (z_info->brand_max == '\0') {
          uVar38 = 0;
        }
        else {
          uVar38 = 0;
          do {
            if (art == (artifact *)0x0) {
              p_Var40 = (_Bool *)0x0;
            }
            else {
              p_Var40 = *pp_Var5 + uVar38;
              if (*pp_Var5 == (_Bool *)0x0) {
                p_Var40 = (_Bool *)0x0;
              }
            }
            if ((obj != (object *)0x0) && (*pp_Var6 != (_Bool *)0x0)) {
              p_Var40 = *pp_Var6 + uVar38;
            }
            uVar21 = Rand_div(3);
            if ((uVar21 == 0) && (p_Var40 != (_Bool *)0x0)) {
              *p_Var40 = false;
            }
            uVar38 = uVar38 + 1;
            bVar9 = z_info->brand_max;
            uVar30 = (uint)bVar9;
          } while (uVar38 < bVar9);
          uVar38 = 0;
          if (bVar9 != 0) {
            uVar38 = 0;
            do {
              if (((art != (artifact *)0x0) && (*pp_Var5 != (_Bool *)0x0)) &&
                 ((*pp_Var5)[uVar38] != false)) goto LAB_0018eecb;
              uVar31 = (uint)bVar9;
              if (((obj != (object *)0x0) && (*pp_Var6 != (_Bool *)0x0)) &&
                 ((*pp_Var6)[uVar38] != false)) goto LAB_0018eeb5;
              uVar38 = uVar38 + 1;
            } while (bVar9 != uVar38);
            uVar38 = (ulong)uVar31;
          }
        }
LAB_0018eeb5:
        uVar30 = uVar31;
        if ((art == (artifact *)0x0) || (pp_Var41 = pp_Var5, (uint)uVar38 != uVar30)) {
LAB_0018eecb:
          if ((obj != (object *)0x0) && (pp_Var41 = pp_Var6, (uint)uVar38 == uVar30))
          goto LAB_0018eed9;
        }
        else {
LAB_0018eed9:
          mem_free(*pp_Var41);
          *pp_Var41 = (_Bool *)0x0;
        }
        lVar42 = 0;
        do {
          peVar36 = obj->el_info;
          if (art != (artifact *)0x0) {
            peVar36 = art->el_info;
          }
          uVar21 = Rand_div(3);
          if (uVar21 == 0) {
            psVar37 = (short *)((long)&peVar36->res_level + lVar42);
            sVar28 = *psVar37;
            if (sVar28 < 100) {
              *psVar37 = 200 - sVar28;
            }
          }
          lVar42 = lVar42 + 4;
        } while (lVar42 != 0x34);
        if (z_info->property_max == 0) {
          uVar38 = 0;
        }
        else {
          lVar42 = 0x14;
          uVar38 = 0;
          do {
            poVar15 = obj_properties;
            uVar21 = Rand_div(3);
            if (((uVar21 == 0) && (*(int *)((long)poVar15->type_mult + lVar42 + -0x2c) == 3)) &&
               ((*(uint *)((long)poVar15->type_mult + lVar42 + -0x28) & 0xfffffffe) == 2)) {
              flag_off(flags,6,*(int *)((long)poVar15->type_mult + lVar42 + -0x20));
            }
            uVar38 = uVar38 + 1;
            lVar42 = lVar42 + 0xf0;
          } while (uVar38 < z_info->property_max);
        }
        iVar39 = (int)uVar38;
        if ((art != (artifact *)0x0) && (L'\0' < art->cost)) {
          art->cost = (uint)art->cost / 3;
        }
      }
LAB_0018efca:
      bVar43 = iVar39 <= (int)uVar20;
      iVar39 = iVar39 + 1;
    } while (bVar43);
  }
  if ((art != (artifact *)0x0) && (art->cost < L'\0')) {
    art->cost = L'\0';
  }
  if (iVar33 != 0) {
    do {
      if (art == (artifact *)0x0) {
        pwVar27 = &obj->kind->alloc_min;
        wVar32 = (wchar_t)obj->tval;
      }
      else {
        wVar32 = art->tval;
        pwVar27 = &art->alloc_min;
      }
      wVar23 = *pwVar27;
      uVar20 = Rand_div(z_info->curse_max - 1);
      pick = uVar20 + L'\x01';
      uVar20 = Rand_div(9);
      iVar19 = m_bonus(9,wVar23);
      if (curses[pick].poss[wVar32] == true) {
        wVar32 = uVar20 + iVar19 * 10 + L'\x01';
        if (art == (artifact *)0x0) {
          append_object_curse(obj,pick,wVar32);
        }
        else {
          append_artifact_curse(art,pick,wVar32);
        }
        iVar33 = iVar33 + -1;
      }
    } while (iVar33 != 0);
  }
  return;
}

Assistant:

static void make_terrible(struct artifact *art, struct object *obj)
{
	int i, gauntlet_runs;
	int num_curses = 1;
	struct object_kind *kind = art ? lookup_kind(art->tval, art->sval) :
		lookup_kind(obj->tval, obj->sval);
	bool weapon = tval_is_melee_weapon_k(kind);

	/* Determine whether the artifact's magics are perilous enough to warrant
	 * extra curses. */
	if (potential >= 3000) {
		num_curses++;
	}
	if ((potential >= 3500) && !one_in_(3)) {
		num_curses++;
	}

	/* Greatly decrease the chance for an activation. */
	if (art && art->activation && !one_in_(3)) {
		art->activation = NULL;
	} else if (obj && obj->activation && !one_in_(3)) {
		obj->activation = NULL;
	}

	/* Force the artifact though the gauntlet two or three times. */
	gauntlet_runs = 1 + randint1(2);
	for (i = 0; i < gauntlet_runs; i++) {
		int j, wheel_of_doom, penalty = 0;

		/* Choose a curse, biased towards penalties to_a, to_d, and to_h. */
		if (weapon && has_property(art, obj, "skill bonus") && one_in_(2)) {
			wheel_of_doom = 2;
		} else if (has_property(art, obj, "armor bonus") && one_in_(2)) {
			wheel_of_doom = 1;
		} else {
			wheel_of_doom = 2 + randint1(2);
		}
		/* Blast base armour class or inflict a penalty to armour class. */
		if (wheel_of_doom == 1) {

			if (art) {
				/* Blast armour and twist magics. */
				if ((art->ac) && (one_in_(6))) {
					art->cost -= 500L * art->ac;
					art->ac = 0;
				}
				if ((art->tval >= TV_BOOTS) && (art->to_a >= 0)) {
					art->to_a = -(5 + randint1(7)) * 2;
				} else if ((one_in_(4)) && (art->tval < TV_BOOTS)) {
					/* Chance of a truly nasty effect for weapons. */
					penalty = randint1(3) + 2;
					penalty *= 5;
					art->to_a = -penalty;
					art->cost -= penalty * 200L;
				}

				/* Artifact might very well still have some value. */
				if (art->to_a < 0) {
					art->cost += art->to_a * 400L;
				}
			} else {
				/* Invert armour class. */
				if ((obj->ac) && (randint1(6) == 1)) {
					obj->ac = 0;
				} else if (randint1(4) == 1) {
					/* Chance of a truly nasty effect. */
					penalty = randint1(3) + 2;
					penalty *= 5;
					obj->to_a = -penalty;
				}
			}
		}

		/* Make either the Skill or Deadliness bonus negative, or both. */
		if (wheel_of_doom == 2) {

			if (art) {
				/* Weapons. */
				if (tval_is_weapon_a(art)) {
					/* Blast items with bonuses, Deadliness more rarely. */
					art->to_h = -(5 + randint1(7)) * 2;
					if (!one_in_(3)) {
						art->to_d = -(5 + randint1(7)) * 2;
					}
				} else {
					/* All armours. */

					/* Reverse any magics. */
					if (art->to_h > 0) {
						art->to_h = -art->to_h;
					}
					if (art->to_d > 0) {
						art->to_d = -art->to_d;
					}

					/* Sometimes, blast even items without bonuses. */
					if (!art->to_d && !art->to_h && one_in_(5)) {
						penalty = randint1(4) + 1;
						penalty *= 5;
						art->to_h -= penalty;
						art->to_d -= penalty;
					}
				}

				/* Artifact might very well still have some value. */
				if ((art->to_d < 0) && (art->to_h < 0)) {
					art->cost -= 10000L;
				} else if ((art->to_d < 0) || (art->to_h < 0)) {
					art->cost -= 5000L;
				}
				if (art->cost < 0) {
					art->cost = 0;
				}
			} else {
				if (randint1(2) == 1) {
					/* One type of badness... */
					/* Blast items with bonuses, Deadliness more rarely. */
					obj->to_h = -(5 + randint1(7)) * 2;
					if (!one_in_(3)) {
						obj->to_d = -(5 + randint1(7)) * 2;
					}
				} else {
					/* ...or another. */
					/* Reverse any magics. */
					if (obj->to_h > 0) {
						obj->to_h = -obj->to_h;
					}
					if (obj->to_d > 0) {
						obj->to_d = -obj->to_d;
					}

					/* Sometimes, blast even items without bonuses. */
					if (!obj->to_d && !obj->to_h && one_in_(5)) {
						penalty = randint1(4) + 1;
						penalty *= 5;
						obj->to_h -= penalty;
						obj->to_d -= penalty;
					}
				}
			}
		}

		/* Make any bonuses negative, or strip all bonuses, and add a random
		 * stat or three with large negative bonuses. */
		if (wheel_of_doom == 3) {
			if (!one_in_(3)) {
				for (j = 0; j < STAT_MAX; j++) {
					int16_t *bonus = art ? &art->modifiers[j] : &obj->modifiers[j];
					if ((*bonus) > 0) {
						*bonus = -(*bonus);
					}
				}

				/* Artifact is highly unlikely to have any value. */
				if (art) {
					art->cost = MAX(art->cost - 30000L, 0);
				}
			} else {
				/* Iron Crown of Beruthiel, here we come... */
				penalty = -(randint1(5)) - 3;
				if (one_in_(3)) {
					penalty *= 5;
				}
				for (j = 0; j < OBJ_MOD_MAX; j++) {
					int16_t *bonus = art ? &art->modifiers[j] : &obj->modifiers[j];
					*bonus = 0;
				}
				if (one_in_(5)) {
					for (j = 0; j < STAT_MAX; j++) {
						int16_t *bonus = art ? &art->modifiers[j] :
							&obj->modifiers[j];
						if (j == OBJ_MOD_STR) *bonus = penalty;
						if (j == OBJ_MOD_DEX) *bonus = penalty;
						if (j == OBJ_MOD_CON) *bonus = penalty;
					}
				} else if (one_in_(4)) {
					for (j = 0; j < STAT_MAX; j++) {
						int16_t *bonus = art ? &art->modifiers[j] :
							&obj->modifiers[j];
						if (j == OBJ_MOD_WIS) *bonus = penalty;
						if (j == OBJ_MOD_INT) *bonus = penalty;
					}
				} else if (one_in_(6)) {
					int16_t *bonus = art ? &art->modifiers[OBJ_MOD_SPEED] :
						&obj->modifiers[OBJ_MOD_SPEED];
					*bonus = penalty;
				} else {
					for (j = 0; j < STAT_MAX; j++) {
						int16_t *bonus = art ? &art->modifiers[j] :
							&obj->modifiers[j];
						if (one_in_(4)) {
							*bonus = penalty;
						}
					}
				}

				/* More curses for good measure... */
				num_curses += randint1(2);

				/* Artifact is highly unlikely to have any value. */
				if (art) {
					art->cost = MAX(art->cost - 60000L, 0);
				}
			}
		}

		/* Strip lots of other qualities. */
		if (wheel_of_doom == 4) {
			bitflag *flags = art ? art->flags : obj->flags;

			/* Powerful modifiers */
			if (art) {
				art->modifiers[OBJ_MOD_BLOWS] = 0;
			} else {
				obj->modifiers[OBJ_MOD_BLOWS] = 0;
			}
			if (one_in_(4)) {
				if (art) {
					art->modifiers[OBJ_MOD_SHOTS] = 0;
				} else {
					obj->modifiers[OBJ_MOD_SHOTS] = 0;
				}
			}
			if (one_in_(4)) {
				if (art) {
					art->modifiers[OBJ_MOD_MIGHT] = 0;
				} else {
					obj->modifiers[OBJ_MOD_MIGHT] = 0;
				}
			}

			/* Slays */
			for (i = 0; i < z_info->slay_max; i++) {
				bool *slay = NULL;
				if (art && art->slays) slay = &art->slays[i];
				if (obj && obj->slays) slay = &obj->slays[i];
				if (one_in_(3) && slay) *slay = false;
			}
			for (i = 0; i < z_info->slay_max; i++) {
				if (art && art->slays && art->slays[i]) break;
				if (obj && obj->slays && obj->slays[i]) break;
			}
			if (art && (i == z_info->slay_max)) {
				mem_free(art->slays);
				art->slays = NULL;
			} else if (obj && (i == z_info->slay_max)) {
				mem_free(obj->slays);
				obj->slays = NULL;
			}
			if (one_in_(3)) {
				of_off(flags, OF_PERFECT_BALANCE);
			}

			/* Brands */
			for (i = 0; i < z_info->brand_max; i++) {
				bool *brand = NULL;
				if (art && art->brands) brand = &art->brands[i];
				if (obj && obj->brands) brand = &obj->brands[i];
				if (one_in_(3) && brand) *brand = false;
			}
			for (i = 0; i < z_info->brand_max; i++) {
				if (art && art->brands && art->brands[i]) break;
				if (obj && obj->brands && obj->brands[i]) break;
			}
			if (art && (i == z_info->brand_max)) {
				mem_free(art->brands);
				art->brands = NULL;
			} else if (obj && (i == z_info->brand_max)) {
				mem_free(obj->brands);
				obj->brands = NULL;
			}

			/* Resists */
			for (i = 0; i < ELEM_HIGH_MAX; i++) {
				int16_t *level = art ? &art->el_info[i].res_level :
					&obj->el_info[i].res_level;
				if (one_in_(3) && (*level < RES_LEVEL_BASE)) {
					*level += 2 * (RES_LEVEL_BASE - *level);
				}
			}

			/* Flags */
			for (i = 0; i < z_info->property_max; i++) {
				struct obj_property *prop = &obj_properties[i];
				if (one_in_(3) && (prop->type == OBJ_PROPERTY_FLAG) &&
					(prop->subtype == OFT_PROT || prop->subtype == OFT_MISC)) {
					of_off(flags, prop->index);
				}
			}

			/* Artifact will still have some value. */
			if (art && art->cost > 0) {
				art->cost /= 3L;
			}
		}
	}

	/* Boundary control. */
	if (art && art->cost < 0) {
		art->cost = 0;
	}

	/* Apply curses. */
	while (num_curses) {
		int level = art ? art->alloc_min : obj->kind->alloc_min;
		int tval = art ? art->tval : obj->tval;
		int pick = randint1(z_info->curse_max - 1);
		int power = randint1(9) + 10 * m_bonus(9, level);
		if (!curses[pick].poss[tval]) {
			continue;
		}
		if (art) {
			append_artifact_curse(art, pick, power);
		} else {
			append_object_curse(obj, pick, power);
		}
		num_curses--;
	}
}